

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::anon_unknown_0::PolyEdgesTestGroup::init
          (PolyEdgesTestGroup *this,EVP_PKEY_CTX *ctx)

{
  undefined1 **ppuVar1;
  long lVar2;
  ulong uVar3;
  Context *pCVar4;
  int i;
  int extraout_EAX;
  TestNode *pTVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  int tri;
  uint uVar9;
  long lVar10;
  undefined1 *puVar11;
  char *pcVar12;
  ostringstream *this_00;
  float sqSum;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3 v2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_2;
  Vector<float,_3> res_7;
  Vec3 v1;
  ostringstream s;
  Vec3 *pVVar19;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  Vec3 local_388;
  ulong *local_378;
  float local_370;
  undefined4 uStack_36c;
  ulong local_368 [2];
  TestNode *local_358;
  float local_350 [4];
  float local_340 [6];
  undefined1 local_328 [16];
  undefined1 *local_318;
  float fStack_310;
  float fStack_30c;
  float local_308 [2];
  float fStack_300;
  float fStack_2fc;
  undefined1 *local_2f8;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8 [2];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 *local_2d8;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c4;
  TestNode *local_2c0;
  long local_2b8;
  size_type *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  char local_298 [112];
  undefined8 local_228;
  undefined1 auStack_220 [8];
  undefined8 uStack_218;
  undefined8 uStack_210;
  float local_208 [20];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  char local_a8 [120];
  
  pcVar12 = local_a8;
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = -0x80;
  local_a8[3] = '?';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = -0x80;
  local_a8[7] = '?';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = -0x80;
  local_a8[0xb] = '?';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = -0x80;
  local_a8[0xf] = '?';
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = -0x80;
  local_a8[0x13] = -0x41;
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = -0x80;
  local_a8[0x17] = '?';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = -0x80;
  local_a8[0x1b] = '?';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = -0x80;
  local_a8[0x1f] = '?';
  local_a8[0x20] = '\0';
  local_a8[0x21] = '\0';
  local_a8[0x22] = -0x80;
  local_a8[0x23] = '?';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = -0x80;
  local_a8[0x27] = -0x41;
  local_a8[0x28] = -0x33;
  local_a8[0x29] = -0x34;
  local_a8[0x2a] = -0x74;
  local_a8[0x2b] = '?';
  local_a8[0x2c] = '\0';
  local_a8[0x2d] = '\0';
  local_a8[0x2e] = -0x80;
  local_a8[0x2f] = '?';
  local_a8[0x30] = '\0';
  local_a8[0x31] = '\0';
  local_a8[0x32] = -0x80;
  local_a8[0x33] = '?';
  local_a8[0x34] = '\0';
  local_a8[0x35] = '\0';
  local_a8[0x36] = -0x80;
  local_a8[0x37] = '?';
  local_a8[0x38] = '\0';
  local_a8[0x39] = '\0';
  local_a8[0x3a] = '\0';
  local_a8[0x3b] = '\0';
  local_a8[0x3c] = '\0';
  local_a8[0x3d] = '\0';
  local_a8[0x3e] = -0x80;
  local_a8[0x3f] = -0x41;
  local_a8[0x40] = '\0';
  local_a8[0x41] = '\0';
  local_a8[0x42] = -0x80;
  local_a8[0x43] = '?';
  local_a8[0x44] = '\0';
  local_a8[0x45] = '\0';
  local_a8[0x46] = '\0';
  local_a8[0x47] = '\0';
  local_a8[0x48] = '\0';
  local_a8[0x49] = '\0';
  local_a8[0x4a] = '\0';
  local_a8[0x4b] = '\0';
  local_a8[0x4c] = '\0';
  local_a8[0x4d] = '\0';
  local_a8[0x4e] = -0x80;
  local_a8[0x4f] = '?';
  local_a8[0x50] = '\0';
  local_a8[0x51] = '\0';
  local_a8[0x52] = '\0';
  local_a8[0x53] = '\0';
  local_a8[0x54] = '\0';
  local_a8[0x55] = '\0';
  local_a8[0x56] = -0x80;
  local_a8[0x57] = '?';
  local_a8[0x58] = '\0';
  local_a8[0x59] = '\0';
  local_a8[0x5a] = '\0';
  local_a8[0x5b] = '\0';
  local_a8[0x5c] = '\0';
  local_a8[0x5d] = '\0';
  local_a8[0x5e] = '\0';
  local_a8[0x5f] = '\0';
  local_a8[0x60] = '\0';
  local_a8[0x61] = '\0';
  local_a8[0x62] = '\0';
  local_a8[99] = '\0';
  local_a8[100] = '\0';
  local_a8[0x65] = '\0';
  local_a8[0x66] = -0x80;
  local_a8[0x67] = '?';
  local_a8[0x68] = '\0';
  local_a8[0x69] = '\0';
  local_a8[0x6a] = '\0';
  local_a8[0x6b] = '\0';
  local_a8[0x6c] = '\0';
  local_a8[0x6d] = '\0';
  local_a8[0x6e] = -0x80;
  local_a8[0x6f] = '?';
  local_a8[0x70] = -0x33;
  local_a8[0x71] = -0x34;
  local_a8[0x72] = -0x34;
  local_a8[0x73] = '=';
  local_a8[0x74] = '\0';
  local_a8[0x75] = '\0';
  local_a8[0x76] = '\0';
  local_a8[0x77] = '\0';
  local_298[0] = '\0';
  local_298[1] = '\0';
  local_298[2] = -0x80;
  local_298[3] = '?';
  local_298[4] = '\n';
  local_298[5] = -0x29;
  local_298[6] = '#';
  local_298[7] = '<';
  local_298[8] = '\0';
  local_298[9] = '\0';
  local_298[10] = '\0';
  local_298[0xb] = '\0';
  local_298[0xc] = '\0';
  local_298[0xd] = '\0';
  local_298[0xe] = '\0';
  local_298[0xf] = '\0';
  local_298[0x10] = '\n';
  local_298[0x11] = -0x29;
  local_298[0x12] = '#';
  local_298[0x13] = '<';
  local_298[0x14] = '\0';
  local_298[0x15] = '\0';
  local_298[0x16] = '\0';
  local_298[0x17] = '\0';
  local_298[0x18] = '\0';
  local_298[0x19] = '\0';
  local_298[0x1a] = '\0';
  local_298[0x1b] = '\0';
  local_298[0x1c] = -0x5c;
  local_298[0x1d] = 'p';
  local_298[0x1e] = '}';
  local_298[0x1f] = '?';
  local_298[0x20] = '\0';
  local_298[0x21] = '\0';
  local_298[0x22] = '\0';
  local_298[0x23] = '\0';
  local_298[0x24] = '\n';
  local_298[0x25] = -0x29;
  local_298[0x26] = '#';
  local_298[0x27] = '<';
  local_298[0x28] = '\0';
  local_298[0x29] = '\0';
  local_298[0x2a] = -0x80;
  local_298[0x2b] = '?';
  local_298[0x2c] = '\0';
  local_298[0x2d] = '\0';
  local_298[0x2e] = '\0';
  local_298[0x2f] = '\0';
  local_298[0x30] = '\n';
  local_298[0x31] = -0x29;
  local_298[0x32] = '#';
  local_298[0x33] = '<';
  local_298[0x34] = '\0';
  local_298[0x35] = '\0';
  local_298[0x36] = '\0';
  local_298[0x37] = '\0';
  local_298[0x38] = '\0';
  local_298[0x39] = '\0';
  local_298[0x3a] = '\0';
  local_298[0x3b] = '\0';
  local_298[0x3c] = -0x5c;
  local_298[0x3d] = 'p';
  local_298[0x3e] = '}';
  local_298[0x3f] = '?';
  local_298[0x40] = '\0';
  local_298[0x41] = '\0';
  local_298[0x42] = '\0';
  local_298[0x43] = '\0';
  local_298[0x44] = '\0';
  local_298[0x45] = '\0';
  local_298[0x46] = '\0';
  local_298[0x47] = '\0';
  local_298[0x48] = '\0';
  local_298[0x49] = '\0';
  local_298[0x4a] = -0x80;
  local_298[0x4b] = '?';
  local_298[0x4c] = '\0';
  local_298[0x4d] = '\0';
  local_298[0x4e] = -0x80;
  local_298[0x4f] = '?';
  local_298[0x50] = '\n';
  local_298[0x51] = -0x29;
  local_298[0x52] = '#';
  local_298[0x53] = '<';
  local_298[0x54] = '\n';
  local_298[0x55] = -0x29;
  local_298[0x56] = '#';
  local_298[0x57] = '<';
  local_298[0x58] = '\n';
  local_298[0x59] = -0x29;
  local_298[0x5a] = '#';
  local_298[0x5b] = -0x44;
  local_298[0x5c] = '\0';
  local_298[0x5d] = '\0';
  local_298[0x5e] = '\0';
  local_298[0x5f] = '\0';
  local_298[0x60] = '\0';
  local_298[0x61] = '\0';
  local_298[0x62] = '\0';
  local_298[99] = '\0';
  local_298[100] = '\0';
  local_298[0x65] = '\0';
  local_298[0x66] = '\0';
  local_298[0x67] = '\0';
  local_298[0x68] = -0x5c;
  local_298[0x69] = 'p';
  local_298[0x6a] = '}';
  local_298[0x6b] = '?';
  lVar10 = 0;
  local_358 = (TestNode *)this;
  do {
    pTVar5 = (TestNode *)operator_new(0xa0);
    pCVar4 = (Context *)local_358[1]._vptr_TestNode;
    pVVar19 = &local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffc68,"quad_at_origin_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_228);
    std::ostream::operator<<((ostringstream *)&local_228,(int)lVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_228);
    std::ios_base::~ios_base((ios_base *)&local_1b8);
    uVar8 = 0xf;
    if (pVVar19 != &local_388) {
      uVar8 = local_388.m_data._0_8_;
    }
    uVar3 = CONCAT44(uStack_36c,local_370) +
            CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
    if (uVar8 < uVar3) {
      uVar8 = 0xf;
      if (local_378 != local_368) {
        uVar8 = local_368[0];
      }
      if (uVar8 < uVar3) goto LAB_00fbb6cc;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)pVVar19);
    }
    else {
LAB_00fbb6cc:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append(&stack0xfffffffffffffc68,(ulong)local_378);
    }
    ppuVar1 = (undefined1 **)(puVar6 + 2);
    if ((undefined1 **)*puVar6 == ppuVar1) {
      local_318 = *ppuVar1;
      _fStack_310 = puVar6[3];
      local_328._0_8_ = &local_318;
    }
    else {
      local_318 = *ppuVar1;
      local_328._0_8_ = (undefined1 **)*puVar6;
    }
    local_328._8_8_ = puVar6[1];
    *puVar6 = ppuVar1;
    puVar6[1] = 0;
    *(undefined1 *)ppuVar1 = 0;
    local_228 = 0;
    auStack_220 = (undefined1  [8])((ulong)auStack_220 & 0xffffffff00000000);
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar5,pCVar4,(char *)local_328._0_8_,pcVar12,
               (WindowRectangle *)(pcVar12 + 0xc),(Vec3 *)&local_228,pVVar19,
               (Vec3 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    tcu::TestNode::addChild(local_358,pTVar5);
    if ((undefined1 **)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,(ulong)(local_318 + 1));
    }
    if (local_378 != local_368) {
      operator_delete(local_378,local_368[0] + 1);
    }
    if (pVVar19 != &local_388) {
      operator_delete(pVVar19,local_388.m_data._0_8_ + 1);
    }
    lVar10 = lVar10 + 1;
    pcVar12 = pcVar12 + 0x18;
  } while (lVar10 != 5);
  pcVar12 = local_298;
  lVar10 = 0;
  this_00 = (ostringstream *)&local_228;
  do {
    pTVar5 = (TestNode *)operator_new(0xa0);
    pCVar4 = (Context *)local_358[1]._vptr_TestNode;
    pVVar19 = &local_388;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffc68,"quad_near_edge_","");
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::ostream::operator<<(this_00,(int)lVar10);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)&local_1b8);
    uVar8 = 0xf;
    if (pVVar19 != &local_388) {
      uVar8 = local_388.m_data._0_8_;
    }
    uVar3 = CONCAT44(uStack_36c,local_370) +
            CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
    if (uVar8 < uVar3) {
      uVar8 = 0xf;
      if (local_378 != local_368) {
        uVar8 = local_368[0];
      }
      if (uVar8 < uVar3) goto LAB_00fbb8a5;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)pVVar19);
    }
    else {
LAB_00fbb8a5:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append(&stack0xfffffffffffffc68,(ulong)local_378);
    }
    ppuVar1 = (undefined1 **)(puVar6 + 2);
    if ((undefined1 **)*puVar6 == ppuVar1) {
      local_318 = *ppuVar1;
      _fStack_310 = puVar6[3];
      local_328._0_8_ = &local_318;
    }
    else {
      local_318 = *ppuVar1;
      local_328._0_8_ = (undefined1 **)*puVar6;
    }
    local_328._8_8_ = puVar6[1];
    *puVar6 = ppuVar1;
    puVar6[1] = 0;
    *(undefined1 *)ppuVar1 = 0;
    QuadFillTest::QuadFillTest
              ((QuadFillTest *)pTVar5,pCVar4,(char *)local_328._0_8_,pcVar12,
               (WindowRectangle *)(pcVar12 + 0xc),(Vec3 *)(pcVar12 + 0x18),pVVar19,
               (Vec3 *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
    tcu::TestNode::addChild(local_358,pTVar5);
    if ((undefined1 **)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,(ulong)(local_318 + 1));
    }
    if (local_378 != local_368) {
      operator_delete(local_378,local_368[0] + 1);
    }
    if (pVVar19 != &local_388) {
      operator_delete(pVVar19,local_388.m_data._0_8_ + 1);
    }
    lVar10 = lVar10 + 1;
    pcVar12 = pcVar12 + 0x24;
    if (lVar10 == 3) {
      pTVar5 = (TestNode *)operator_new(0xa0);
      pCVar4 = (Context *)local_358[1]._vptr_TestNode;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar5,pCVar4->m_testCtx,"poly_fan","polygon edge clipping");
      ((TestNode *)&pTVar5[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)pCVar4;
      pTVar5[1].m_testCtx = (TestContext *)0x3200000032;
      pTVar5[1].m_name._M_dataplus._M_p = (pointer)0x6400000064;
      local_2b0 = &pTVar5[1].m_name._M_string_length;
      pTVar5[1].m_name._M_string_length = 0;
      pTVar5[1].m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar5[1].m_name.field_2 + 8) = 0;
      ((TestNode *)&pTVar5->_vptr_TestNode)->_vptr_TestNode =
           (_func_int **)&PTR__TriangleFillTest_02131fe0;
      puVar11 = auStack_220 + 4;
      local_228 = 0x3f8000003f800000;
      auStack_220 = (undefined1  [8])0x3f800000;
      uStack_218 = 0x3f8000003f800000;
      uStack_210 = 0x3f800000;
      local_208[0] = 1.0;
      local_208[1] = 1.0;
      local_208[2] = -1.0;
      local_208[3] = 1.0;
      local_208[4] = 1.0;
      local_208[5] = 0.0;
      local_208[6] = 1.0;
      local_208[7] = 1.0;
      local_208[8] = -1.0;
      local_208[9] = 0.0;
      local_208[10] = 1.0;
      local_208[0xb] = -1.0;
      local_208[0xc] = -1.0;
      local_208[0xd] = 1.0;
      local_208[0xe] = -1.0;
      local_208[0xf] = 0.0;
      local_208[0x10] = 0.0;
      local_208[0x11] = -1.0;
      local_208[0x12] = -1.0;
      local_208[0x13] = -1.0;
      local_1b8 = 0xbf800000bf800000;
      uStack_1b0 = 0xbf80000000000000;
      local_1a8 = 0xbf800000bf800000;
      uStack_1a0 = 0xbf80000000000000;
      local_198 = 0x3f800000bf800000;
      uStack_190 = 0xbf800000bf800000;
      local_188 = 0xbf80000000000000;
      uStack_180 = 0x3f800000bf800000;
      local_178 = 0xbf80000000000000;
      uStack_170 = 0x3f8000003f800000;
      local_168 = 0x3f800000bf800000;
      uStack_160 = 0;
      local_158 = 0x3f8000003f800000;
      puVar6 = &uStack_210;
      lVar10 = 0;
      local_2c0 = pTVar5;
      do {
        lVar2 = lVar10 * 0x24;
        uVar9 = 0;
        local_2b8 = lVar10;
        do {
          if (uVar9 == 0) {
            fVar17 = (float)*(undefined8 *)(auStack_220 + lVar2 + 4);
            fVar18 = (float)((ulong)*(undefined8 *)(auStack_220 + lVar2 + 4) >> 0x20);
            fVar13 = *(float *)((long)&uStack_218 + lVar2 + 4);
LAB_00fbbcba:
            local_328._8_8_ = (ulong)(uint)local_328._12_4_ << 0x20;
            local_328._0_4_ = 0.0;
            local_328._4_4_ = 0.0;
            lVar7 = 0;
            do {
              *(float *)(local_328 + lVar7 * 4) =
                   *(float *)(puVar11 + lVar7 * 4) - *(float *)(puVar11 + lVar7 * 4 + -0xc);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar7 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc68 + lVar7 * 4) =
                   *(float *)((long)puVar6 + lVar7 * 4) -
                   *(float *)((long)puVar6 + lVar7 * 4 + -0x18);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            local_340[3] = (float)(int)(uVar9 + 1) / 40.0;
            local_340[4] = local_340[3];
            local_340[5] = local_340[3];
            local_350[0] = 0.0;
            local_350[1] = 0.0;
            local_350[2] = 0.0;
            lVar7 = 0;
            do {
              local_350[lVar7] =
                   (1.0 - local_340[lVar7 + 3]) * *(float *)(local_328 + lVar7 * 4) +
                   local_340[lVar7 + 3] * *(float *)(&stack0xfffffffffffffc68 + lVar7 * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            fVar15 = 0.0;
            lVar7 = 0;
            do {
              fVar15 = fVar15 + local_350[lVar7] * local_350[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            if (fVar15 < 0.0) {
              local_2a8 = CONCAT44(fVar18,fVar17);
              uStack_2a0 = 0;
              local_2c4 = fVar13;
              fVar15 = sqrtf(fVar15);
              fVar17 = (float)local_2a8;
              fVar18 = local_2a8._4_4_;
              fVar13 = local_2c4;
            }
            else {
              fVar15 = SQRT(fVar15);
            }
            local_340[2] = 0.0;
            local_340[0] = 0.0;
            local_340[1] = 0.0;
            lVar7 = 0;
            do {
              local_340[lVar7] = local_350[lVar7] * (1.0 / fVar15);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            local_370 = 0.0;
            local_378 = (ulong *)0x0;
            lVar7 = 0;
            do {
              *(float *)((long)&local_378 + lVar7 * 4) =
                   *(float *)(this_00 + lVar7 * 4) + local_340[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            fVar14 = SUB84(local_378,0);
            fVar16 = (float)((ulong)local_378 >> 0x20);
            fVar15 = local_370;
            if ((uVar9 & 1) != 0) goto LAB_00fbbe7f;
            fStack_310 = 1.0;
          }
          else {
            local_328._8_8_ = local_328._8_8_ & 0xffffffff00000000;
            local_328._0_4_ = 0.0;
            local_328._4_4_ = 0.0;
            lVar7 = 0;
            do {
              *(float *)(local_328 + lVar7 * 4) =
                   *(float *)(puVar11 + lVar7 * 4) - *(float *)(puVar11 + lVar7 * 4 + -0xc);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            lVar7 = 0;
            do {
              *(float *)(&stack0xfffffffffffffc68 + lVar7 * 4) =
                   *(float *)((long)puVar6 + lVar7 * 4) -
                   *(float *)((long)puVar6 + lVar7 * 4 + -0x18);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            local_340[3] = (float)(int)uVar9 / 40.0;
            local_340[4] = local_340[3];
            local_340[5] = local_340[3];
            local_350[0] = 0.0;
            local_350[1] = 0.0;
            local_350[2] = 0.0;
            lVar7 = 0;
            do {
              local_350[lVar7] =
                   (1.0 - local_340[lVar7 + 3]) * *(float *)(local_328 + lVar7 * 4) +
                   local_340[lVar7 + 3] * *(float *)(&stack0xfffffffffffffc68 + lVar7 * 4);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            fVar13 = 0.0;
            lVar7 = 0;
            do {
              fVar13 = fVar13 + local_350[lVar7] * local_350[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            if (fVar13 < 0.0) {
              fVar13 = sqrtf(fVar13);
            }
            else {
              fVar13 = SQRT(fVar13);
            }
            local_340[2] = 0.0;
            local_340[0] = 0.0;
            local_340[1] = 0.0;
            lVar7 = 0;
            do {
              local_340[lVar7] = local_350[lVar7] * (1.0 / fVar13);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            local_370 = 0.0;
            local_378 = (ulong *)0x0;
            lVar7 = 0;
            do {
              *(float *)((long)&local_378 + lVar7 * 4) =
                   *(float *)(this_00 + lVar7 * 4) + local_340[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
            fVar17 = SUB84(local_378,0);
            fVar18 = (float)((ulong)local_378 >> 0x20);
            fVar13 = local_370;
            if (uVar9 != 0x27) goto LAB_00fbbcba;
            fVar14 = (float)*(undefined8 *)((long)&uStack_210 + lVar2);
            fVar16 = (float)((ulong)*(undefined8 *)((long)&uStack_210 + lVar2) >> 0x20);
            fVar15 = local_208[lVar10 * 9];
LAB_00fbbe7f:
            fStack_310 = 0.5;
          }
          local_318 = &DAT_3f0000003f000000;
          fStack_30c = 0.5;
          local_2f8 = &DAT_3f0000003f000000;
          fStack_2ec = 0.5;
          fStack_2f0 = fStack_310;
          local_2d8 = &DAT_3f0000003f000000;
          fStack_2cc = 0.5;
          fStack_2d0 = fStack_310;
          local_328._0_4_ = 0.0;
          local_328._4_4_ = 0.0;
          local_328._8_8_ = 0x3f80000000000000;
          local_308[1] = fVar18 * 70000.0;
          local_308[0] = fVar17 * 70000.0;
          fStack_2fc = 1.0;
          fStack_300 = fVar13 * 70000.0;
          local_2e8[1] = fVar16 * 70000.0;
          local_2e8[0] = fVar14 * 70000.0;
          fStack_2dc = 1.0;
          fStack_2e0 = fVar15 * 70000.0;
          std::
          vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
          ::push_back((vector<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                       *)local_2b0,(value_type *)local_328);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x28);
        lVar10 = local_2b8 + 1;
        puVar11 = puVar11 + 0x24;
        puVar6 = (undefined8 *)((long)puVar6 + 0x24);
        this_00 = this_00 + 0x24;
        if (lVar10 == 6) {
          tcu::TestNode::addChild(local_358,local_2c0);
          return extraout_EAX;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void PolyEdgesTestGroup::init (void)
{
	// Quads via origin
	const struct Quad
	{
		tcu::Vec3 d1; // tangent
		tcu::Vec3 d2; // bi-tangent
	} quads[] =
	{
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3( 1,   -1, 1) },
		{ tcu::Vec3( 1, 1, 1),	tcu::Vec3(-1, 1.1f, 1) },
		{ tcu::Vec3( 1, 1, 0),	tcu::Vec3(-1,    1, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1,    0, 0) },
		{ tcu::Vec3( 0, 1, 0),	tcu::Vec3( 1, 0.1f, 0) },
	};

	// Quad near edge
	const struct EdgeQuad
	{
		tcu::Vec3 d1;		// tangent
		tcu::Vec3 d2;		// bi-tangent
		tcu::Vec3 center;	// center
	} edgeQuads[] =
	{
		{ tcu::Vec3( 1,     0.01f, 0    ),	tcu::Vec3( 0,      0.01f,  0),  tcu::Vec3( 0,     0.99f, 0    ) }, // edge near x-plane
		{ tcu::Vec3( 0.01f, 1,     0    ),	tcu::Vec3( 0.01f,  0,      0),  tcu::Vec3( 0.99f, 0,     0    ) }, // edge near y-plane
		{ tcu::Vec3( 1,     1,     0.01f),	tcu::Vec3( 0.01f,  -0.01f, 0),  tcu::Vec3( 0,     0,     0.99f) }, // edge near z-plane
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(quads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_at_origin_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, quads[ndx].d1, quads[ndx].d2));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(edgeQuads); ++ndx)
		addChild(new QuadFillTest(m_context, (std::string("quad_near_edge_") + de::toString(ndx)).c_str(), "polygon edge clipping", VIEWPORT_CENTER, edgeQuads[ndx].d1, edgeQuads[ndx].d2, edgeQuads[ndx].center));

	// Polyfan
	addChild(new TriangleFanFillTest(m_context, "poly_fan", "polygon edge clipping", VIEWPORT_CENTER));
}